

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  value_type *pvVar1;
  ImVector<ImGuiWindowSettings> *this;
  int i;
  
  this = &GImGui->SettingsWindows;
  i = 0;
  while( true ) {
    if (i == this->Size) {
      return (ImGuiWindowSettings *)0x0;
    }
    pvVar1 = ImVector<ImGuiWindowSettings>::operator[](this,i);
    if (pvVar1->Id == id) break;
    i = i + 1;
  }
  pvVar1 = ImVector<ImGuiWindowSettings>::operator[](this,i);
  return pvVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].Id == id)
            return &g.SettingsWindows[i];
    return NULL;
}